

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

void __thiscall slang::JsonWriter::writeQuoted(JsonWriter *this,string_view str)

{
  size_t sVar1;
  char buf [5];
  char local_82;
  char c;
  JsonWriter *local_80;
  char *local_78;
  SmallVector<char,_40UL> vec;
  
  local_78 = str._M_str;
  local_80 = this;
  SmallVector<char,_40UL>::SmallVector
            ((SmallVector<char,_40UL> *)&vec.super_SmallVectorBase<char>,str._M_len + 2);
  buf[0] = '\"';
  SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
  sVar1 = 0;
  do {
    if (str._M_len == sVar1) {
      buf[0] = '\"';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (local_80->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,
                 vec.super_SmallVectorBase<char>.data_,
                 vec.super_SmallVectorBase<char>.data_ + vec.super_SmallVectorBase<char>.len);
      SmallVectorBase<char>::cleanup
                (&vec.super_SmallVectorBase<char>,
                 (EVP_PKEY_CTX *)vec.super_SmallVectorBase<char>.data_);
      return;
    }
    c = local_78[sVar1];
    switch(c) {
    case '\b':
      buf[0] = '\\';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      buf[0] = 'b';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      break;
    case '\t':
      buf[0] = '\\';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      buf[0] = 't';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      break;
    case '\n':
      buf[0] = '\\';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      buf[0] = 'n';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      break;
    case '\v':
switchD_001f3a6a_caseD_b:
      if ((byte)c < 0x20) {
        snprintf(buf,5,"%04x");
        local_82 = '\\';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,&local_82);
        local_82 = 'u';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,&local_82);
        SmallVectorBase<char>::append<char_*>(&vec.super_SmallVectorBase<char>,buf,buf + 4);
      }
      else {
        SmallVectorBase<char>::emplace_back<char_const&>(&vec.super_SmallVectorBase<char>,&c);
      }
      break;
    case '\f':
      buf[0] = '\\';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      buf[0] = 'f';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      break;
    case '\r':
      buf[0] = '\\';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      buf[0] = 'r';
      SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      break;
    default:
      if (c == 0x5c) {
        buf[0] = '\\';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
        buf[0] = '\\';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      }
      else {
        if (c != 0x22) goto switchD_001f3a6a_caseD_b;
        buf[0] = '\\';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
        buf[0] = '\"';
        SmallVectorBase<char>::emplace_back<char>(&vec.super_SmallVectorBase<char>,buf);
      }
    }
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

void JsonWriter::writeQuoted(std::string_view str) {
    SmallVector<char> vec(str.size() + 2, UninitializedTag());
    vec.push_back('"');
    for (char c : str) {
        switch (c) {
            case '"':
                vec.push_back('\\');
                vec.push_back('"');
                break;
            case '\\':
                vec.push_back('\\');
                vec.push_back('\\');
                break;
            case '\b':
                vec.push_back('\\');
                vec.push_back('b');
                break;
            case '\f':
                vec.push_back('\\');
                vec.push_back('f');
                break;
            case '\n':
                vec.push_back('\\');
                vec.push_back('n');
                break;
            case '\r':
                vec.push_back('\\');
                vec.push_back('r');
                break;
            case '\t':
                vec.push_back('\\');
                vec.push_back('t');
                break;
            default:
#if CHAR_MIN < 0
                if (c >= 0x00 and c <= 0x1f) {
#else
                if (c <= 0x1f) {
#endif
                    // print character c as \uxxxx
                    char buf[5];
                    snprintf(buf, sizeof(buf), "%04x", int(c));
                    vec.push_back('\\');
                    vec.push_back('u');
                    vec.append(buf, buf + 4);
                }
                else {
                    // all other characters are added as-is
                    vec.push_back(c);
                }
                break;
        }
    }

    vec.push_back('"');
    buffer->append(toStringView(vec));
}

void JsonWriter::endValue() {
    buffer->append(",");
    if (pretty)
        buffer->format("\n{:{}}", "", currentIndent);
}

size_t JsonWriter::findLastComma() const {
    size_t size = buffer->size();
    if (pretty) {
        while (size && (buffer->data()[size - 1] == ' ' || buffer->data()[size - 1] == '\n'))
            size--;
    }

    if (size && buffer->data()[size - 1] == ',')
        size--;

    return size;
}

}